

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.h
# Opt level: O3

void __thiscall pmx::PmxModel::~PmxModel(PmxModel *this)

{
  PmxSoftBody *__ptr;
  PmxJoint *__ptr_00;
  PmxRigidBody *__ptr_01;
  PmxFrame *__ptr_02;
  PmxMorph *__ptr_03;
  PmxBone *__ptr_04;
  PmxMaterial *__ptr_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_06;
  int *piVar1;
  PmxVertex *__ptr_07;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  __ptr = (this->soft_bodies)._M_t.
          super___uniq_ptr_impl<pmx::PmxSoftBody,_std::default_delete<pmx::PmxSoftBody[]>_>._M_t.
          super__Tuple_impl<0UL,_pmx::PmxSoftBody_*,_std::default_delete<pmx::PmxSoftBody[]>_>.
          super__Head_base<0UL,_pmx::PmxSoftBody_*,_false>._M_head_impl;
  if (__ptr != (PmxSoftBody *)0x0) {
    std::default_delete<pmx::PmxSoftBody[]>::operator()
              ((default_delete<pmx::PmxSoftBody[]> *)&this->soft_bodies,__ptr);
  }
  (this->soft_bodies)._M_t.
  super___uniq_ptr_impl<pmx::PmxSoftBody,_std::default_delete<pmx::PmxSoftBody[]>_>._M_t.
  super__Tuple_impl<0UL,_pmx::PmxSoftBody_*,_std::default_delete<pmx::PmxSoftBody[]>_>.
  super__Head_base<0UL,_pmx::PmxSoftBody_*,_false>._M_head_impl = (PmxSoftBody *)0x0;
  __ptr_00 = (this->joints)._M_t.
             super___uniq_ptr_impl<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>_>._M_t.
             super__Tuple_impl<0UL,_pmx::PmxJoint_*,_std::default_delete<pmx::PmxJoint[]>_>.
             super__Head_base<0UL,_pmx::PmxJoint_*,_false>._M_head_impl;
  if (__ptr_00 != (PmxJoint *)0x0) {
    std::default_delete<pmx::PmxJoint[]>::operator()
              ((default_delete<pmx::PmxJoint[]> *)&this->joints,__ptr_00);
  }
  (this->joints)._M_t.super___uniq_ptr_impl<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>_>.
  _M_t.super__Tuple_impl<0UL,_pmx::PmxJoint_*,_std::default_delete<pmx::PmxJoint[]>_>.
  super__Head_base<0UL,_pmx::PmxJoint_*,_false>._M_head_impl = (PmxJoint *)0x0;
  __ptr_01 = (this->rigid_bodies)._M_t.
             super___uniq_ptr_impl<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>_>.
             _M_t.
             super__Tuple_impl<0UL,_pmx::PmxRigidBody_*,_std::default_delete<pmx::PmxRigidBody[]>_>.
             super__Head_base<0UL,_pmx::PmxRigidBody_*,_false>._M_head_impl;
  if (__ptr_01 != (PmxRigidBody *)0x0) {
    std::default_delete<pmx::PmxRigidBody[]>::operator()
              ((default_delete<pmx::PmxRigidBody[]> *)&this->rigid_bodies,__ptr_01);
  }
  (this->rigid_bodies)._M_t.
  super___uniq_ptr_impl<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>_>._M_t.
  super__Tuple_impl<0UL,_pmx::PmxRigidBody_*,_std::default_delete<pmx::PmxRigidBody[]>_>.
  super__Head_base<0UL,_pmx::PmxRigidBody_*,_false>._M_head_impl = (PmxRigidBody *)0x0;
  __ptr_02 = (this->frames)._M_t.
             super___uniq_ptr_impl<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>_>._M_t.
             super__Tuple_impl<0UL,_pmx::PmxFrame_*,_std::default_delete<pmx::PmxFrame[]>_>.
             super__Head_base<0UL,_pmx::PmxFrame_*,_false>._M_head_impl;
  if (__ptr_02 != (PmxFrame *)0x0) {
    std::default_delete<pmx::PmxFrame[]>::operator()
              ((default_delete<pmx::PmxFrame[]> *)&this->frames,__ptr_02);
  }
  (this->frames)._M_t.super___uniq_ptr_impl<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>_>.
  _M_t.super__Tuple_impl<0UL,_pmx::PmxFrame_*,_std::default_delete<pmx::PmxFrame[]>_>.
  super__Head_base<0UL,_pmx::PmxFrame_*,_false>._M_head_impl = (PmxFrame *)0x0;
  __ptr_03 = (this->morphs)._M_t.
             super___uniq_ptr_impl<pmx::PmxMorph,_std::default_delete<pmx::PmxMorph[]>_>._M_t.
             super__Tuple_impl<0UL,_pmx::PmxMorph_*,_std::default_delete<pmx::PmxMorph[]>_>.
             super__Head_base<0UL,_pmx::PmxMorph_*,_false>._M_head_impl;
  if (__ptr_03 != (PmxMorph *)0x0) {
    std::default_delete<pmx::PmxMorph[]>::operator()
              ((default_delete<pmx::PmxMorph[]> *)&this->morphs,__ptr_03);
  }
  (this->morphs)._M_t.super___uniq_ptr_impl<pmx::PmxMorph,_std::default_delete<pmx::PmxMorph[]>_>.
  _M_t.super__Tuple_impl<0UL,_pmx::PmxMorph_*,_std::default_delete<pmx::PmxMorph[]>_>.
  super__Head_base<0UL,_pmx::PmxMorph_*,_false>._M_head_impl = (PmxMorph *)0x0;
  __ptr_04 = (this->bones)._M_t.
             super___uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>._M_t.
             super__Tuple_impl<0UL,_pmx::PmxBone_*,_std::default_delete<pmx::PmxBone[]>_>.
             super__Head_base<0UL,_pmx::PmxBone_*,_false>._M_head_impl;
  if (__ptr_04 != (PmxBone *)0x0) {
    std::default_delete<pmx::PmxBone[]>::operator()
              ((default_delete<pmx::PmxBone[]> *)&this->bones,__ptr_04);
  }
  (this->bones)._M_t.super___uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>._M_t.
  super__Tuple_impl<0UL,_pmx::PmxBone_*,_std::default_delete<pmx::PmxBone[]>_>.
  super__Head_base<0UL,_pmx::PmxBone_*,_false>._M_head_impl = (PmxBone *)0x0;
  __ptr_05 = (this->materials)._M_t.
             super___uniq_ptr_impl<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>_>._M_t.
             super__Tuple_impl<0UL,_pmx::PmxMaterial_*,_std::default_delete<pmx::PmxMaterial[]>_>.
             super__Head_base<0UL,_pmx::PmxMaterial_*,_false>._M_head_impl;
  if (__ptr_05 != (PmxMaterial *)0x0) {
    std::default_delete<pmx::PmxMaterial[]>::operator()
              ((default_delete<pmx::PmxMaterial[]> *)&this->materials,__ptr_05);
  }
  (this->materials)._M_t.
  super___uniq_ptr_impl<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>_>._M_t.
  super__Tuple_impl<0UL,_pmx::PmxMaterial_*,_std::default_delete<pmx::PmxMaterial[]>_>.
  super__Head_base<0UL,_pmx::PmxMaterial_*,_false>._M_head_impl = (PmxMaterial *)0x0;
  __ptr_06 = (this->textures)._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
  if (__ptr_06 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::default_delete<std::__cxx11::string[]>::operator()
              ((default_delete<std::__cxx11::string[]> *)&this->textures,__ptr_06);
  }
  (this->textures)._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  piVar1 = (this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  if (piVar1 != (int *)0x0) {
    operator_delete__(piVar1);
  }
  (this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (int *)0x0;
  __ptr_07 = (this->vertices)._M_t.
             super___uniq_ptr_impl<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>_>._M_t.
             super__Tuple_impl<0UL,_pmx::PmxVertex_*,_std::default_delete<pmx::PmxVertex[]>_>.
             super__Head_base<0UL,_pmx::PmxVertex_*,_false>._M_head_impl;
  if (__ptr_07 != (PmxVertex *)0x0) {
    std::default_delete<pmx::PmxVertex[]>::operator()
              ((default_delete<pmx::PmxVertex[]> *)&this->vertices,__ptr_07);
  }
  (this->vertices)._M_t.
  super___uniq_ptr_impl<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>_>._M_t.
  super__Tuple_impl<0UL,_pmx::PmxVertex_*,_std::default_delete<pmx::PmxVertex[]>_>.
  super__Head_base<0UL,_pmx::PmxVertex_*,_false>._M_head_impl = (PmxVertex *)0x0;
  pcVar2 = (this->model_english_comment)._M_dataplus._M_p;
  paVar3 = &(this->model_english_comment).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->model_comment)._M_dataplus._M_p;
  paVar3 = &(this->model_comment).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->model_english_name)._M_dataplus._M_p;
  paVar3 = &(this->model_english_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->model_name)._M_dataplus._M_p;
  paVar3 = &(this->model_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

PmxModel()
			: version(0.0f)
			, vertex_count(0)
			, index_count(0)
			, texture_count(0)
			, material_count(0)
			, bone_count(0)
			, morph_count(0)
			, frame_count(0)
			, rigid_body_count(0)
			, joint_count(0)
			, soft_body_count(0)
		{}